

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::WriteCheckpoint(cmCTestMultiProcessHandler *this,int index)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  char local_268 [8];
  ofstream fout;
  string local_58;
  undefined1 local_38 [8];
  string fname;
  int index_local;
  cmCTestMultiProcessHandler *this_local;
  
  fname.field_2._12_4_ = index;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_58,this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&local_58);
  std::ofstream::ofstream(local_268);
  _Var1 = std::__cxx11::string::c_str();
  std::ofstream::open(local_268,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(local_268,fname.field_2._12_4_);
  std::operator<<(poVar2,"\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_268);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::WriteCheckpoint(int index)
{
  std::string fname = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/CTestCheckpoint.txt";
  cmsys::ofstream fout;
  fout.open(fname.c_str(), std::ios::app);
  fout << index << "\n";
  fout.close();
}